

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC UINT16_Unmarshal(UINT16 *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC local_24;
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  UINT16 *target_local;
  
  iVar1 = *size;
  *size = iVar1 + -2;
  if (iVar1 + -2 < 0) {
    local_24 = 0x9a;
  }
  else {
    UVar2 = ByteArrayToUint16(*buffer);
    *target = UVar2;
    *buffer = *buffer + 2;
    local_24 = 0;
  }
  return local_24;
}

Assistant:

TPM_RC UINT16_Unmarshal(UINT16 *target, BYTE **buffer, INT32 *size)
{
    TPM_RC result;
    if ((*size -= 2) < 0)
    {
        result = TPM_RC_INSUFFICIENT;
    }
    else
    {
        *target = BYTE_ARRAY_TO_UINT16(*buffer);
        *buffer += 2;
        result = TPM_RC_SUCCESS;
    }
    return result;
}